

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void cab_checksum_update(archive_read *a,size_t bytes)

{
  undefined1 uVar1;
  int iVar2;
  int *piVar3;
  uint32_t uVar4;
  uint uVar5;
  size_t sStack_38;
  wchar_t odd;
  size_t sumbytes;
  uchar *p;
  cfdata *cfdata;
  cab *cab;
  size_t bytes_local;
  archive_read *a_local;
  
  piVar3 = *(int **)((long)a->format->data + 0x38);
  if ((*piVar3 != 0) && (*(long *)(piVar3 + 0xe) != 0)) {
    sumbytes = *(size_t *)(piVar3 + 0xe);
    sStack_38 = bytes;
    if (piVar3[0xc] != 0) {
      for (; piVar3[0xc] < 4 && sStack_38 != 0; sStack_38 = sStack_38 - 1) {
        uVar1 = *(undefined1 *)sumbytes;
        iVar2 = piVar3[0xc];
        piVar3[0xc] = iVar2 + 1;
        *(undefined1 *)((long)piVar3 + (long)iVar2 + 0x2c) = uVar1;
        sumbytes = sumbytes + 1;
      }
      if (piVar3[0xc] == 4) {
        uVar4 = cab_checksum_cfdata_4(piVar3 + 0xb,4,piVar3[10]);
        piVar3[10] = uVar4;
        piVar3[0xc] = 0;
      }
    }
    if (sStack_38 != 0) {
      uVar5 = (uint)sStack_38 & 3;
      if (sStack_38 != (long)(int)uVar5) {
        uVar4 = cab_checksum_cfdata_4((void *)sumbytes,sStack_38 - (long)(int)uVar5,piVar3[10]);
        piVar3[10] = uVar4;
      }
      if ((sStack_38 & 3) != 0) {
        memcpy(piVar3 + 0xb,(void *)((sumbytes + sStack_38) - (long)(int)uVar5),(long)(int)uVar5);
      }
      piVar3[0xc] = uVar5;
    }
    piVar3[0xe] = 0;
    piVar3[0xf] = 0;
  }
  return;
}

Assistant:

static void
cab_checksum_update(struct archive_read *a, size_t bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata = cab->entry_cfdata;
	const unsigned char *p;
	size_t sumbytes;

	if (cfdata->sum == 0 || cfdata->sum_ptr == NULL)
		return;
	/*
	 * Calculate the sum of this CFDATA.
	 * Make sure CFDATA must be calculated in four bytes.
	 */
	p = cfdata->sum_ptr;
	sumbytes = bytes;
	if (cfdata->sum_extra_avail) {
		while (cfdata->sum_extra_avail < 4 && sumbytes > 0) {
			cfdata->sum_extra[
			    cfdata->sum_extra_avail++] = *p++;
			sumbytes--;
		}
		if (cfdata->sum_extra_avail == 4) {
			cfdata->sum_calculated = cab_checksum_cfdata_4(
			    cfdata->sum_extra, 4, cfdata->sum_calculated);
			cfdata->sum_extra_avail = 0;
		}
	}
	if (sumbytes) {
		int odd = sumbytes & 3;
		if (sumbytes - odd > 0)
			cfdata->sum_calculated = cab_checksum_cfdata_4(
			    p, sumbytes - odd, cfdata->sum_calculated);
		if (odd)
			memcpy(cfdata->sum_extra, p + sumbytes - odd, odd);
		cfdata->sum_extra_avail = odd;
	}
	cfdata->sum_ptr = NULL;
}